

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IncDecVerify.cpp
# Opt level: O2

void incdec_verify::PreIncTestUint16(void)

{
  bool expected;
  unsigned_short t;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *pSVar1;
  long lVar2;
  allocator local_51;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> si
  ;
  
  for (lVar2 = 4; lVar2 != 0x3a; lVar2 = lVar2 + 6) {
    t = *(unsigned_short *)(&UNK_0015a8dc + lVar2);
    si.m_int = t;
    pSVar1 = SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             ::operator++(&si);
    expected = *(bool *)((long)&inc_uint16 + lVar2);
    if ((pSVar1->m_int == *(unsigned_short *)(&UNK_0015a8de + lVar2)) != expected) {
      std::__cxx11::string::string((string *)&si,"Error in case inc_uint16 throw (1): ",&local_51);
      err_msg<unsigned_short>((string *)&si,t,expected);
      std::__cxx11::string::~string((string *)&si);
    }
  }
  return;
}

Assistant:

void PreIncTestUint16()
{
	size_t i;

	for( i = 0; i < COUNTOF(inc_uint16); ++i )
	{
		bool fSuccess = true;
		try
		{
			SafeInt<std::uint16_t> si(inc_uint16[i].x);
			SafeInt<std::uint16_t> vv = ++si;

			if(vv != inc_uint16[i].y)
			{
				fSuccess = false;
			}
		}
		catch(SafeIntException&)
		{
			fSuccess = false;
		}

		if( fSuccess != inc_uint16[i].fExpected )
		{
			err_msg( "Error in case inc_uint16 throw (1): ", inc_uint16[i].x, inc_uint16[i].fExpected );
		}
	}
}